

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionGeneralizationImpl.hpp
# Opt level: O1

void __thiscall
Inferences::AdditionGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
          *poly)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
  *this_00;
  undefined4 var_00;
  Variable key;
  Cell *pCVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  Variable v;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar8;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *o;
  bool bVar9;
  anon_class_16_2_f84bbffd f;
  Option<Kernel::Variable> var;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> factor;
  MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> gen;
  Set<Kernel::Variable,_Lib::StlHash> didOccur;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> monom;
  undefined1 local_140 [8];
  undefined8 local_138;
  __mpz_struct _Stack_130;
  uint local_120;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *local_110;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_108;
  ulong local_100;
  ulong local_f8;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_f0;
  ulong local_e8;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_e0;
  Set<Kernel::Variable,_Lib::StlHash> local_c0;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_98;
  __mpz_struct local_88;
  __mpz_struct local_78;
  uint local_68;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_60;
  RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>
  local_54 [36];
  
  local_c0._capacity = 0;
  local_c0._nonemptyCells = 0;
  local_c0._size = 0;
  local_c0._entries = (Cell *)0x0;
  ::Lib::Set<Kernel::Variable,_Lib::StlHash>::expand(&local_c0);
  local_108 = poly->_ptr;
  o = (local_108->_summands)._stack;
  pMVar1 = (local_108->_summands)._cursor;
  lVar6 = (long)pMVar1 - (long)o;
  local_110 = poly;
  if (o != (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0 && lVar6 != 0) {
    local_100 = (lVar6 >> 4) * -0x5555555555555555;
    uVar4 = (ulong)(pMVar1 != o);
    do {
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&local_88,(IntegerConstantType *)o);
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)&local_78,&(o->numeral)._den);
      local_68 = (o->factors)._id;
      local_60 = (o->factors)._ptr;
      Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryVar
                ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)local_140);
      var_00 = local_140._4_4_;
      local_f8 = uVar4;
      if (local_140[0] == '\x01') {
        uVar5 = 2;
        if (2 < (uint)local_140._4_4_) {
          uVar5 = local_140._4_4_;
        }
        uVar4 = (ulong)uVar5 % (local_c0._0_8_ & 0xffffffff);
        uVar7 = local_c0._entries[uVar4].code;
        bVar9 = uVar7 != 0;
        if (bVar9) {
          pCVar3 = local_c0._entries + uVar4;
          bVar9 = true;
          do {
            if ((uVar7 == uVar5) && ((pCVar3->value)._num == local_140._4_4_)) break;
            pCVar3 = pCVar3 + 1;
            if (pCVar3 == local_c0._afterLast) {
              pCVar3 = local_c0._entries;
            }
            uVar7 = pCVar3->code;
            bVar9 = uVar7 != 0;
          } while (bVar9);
        }
        if (bVar9) goto LAB_004a0c36;
        local_e0._capacity._0_4_ = local_140._4_4_;
        ::Lib::Set<Kernel::Variable,Lib::StlHash>::
        rawFindOrInsert<Lib::Set<Kernel::Variable,Lib::StlHash>::insert(Kernel::Variable,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Variable,Lib::StlHash>::insert(Kernel::Variable,unsigned_int)::_lambda(auto:1)_1_>
                  ((Set<Kernel::Variable,Lib::StlHash> *)&local_c0,
                   (anon_class_8_1_ba1d8281)&local_e0,local_140._4_4_,
                   (anon_class_8_1_ba1d8281)&local_e0,(bool *)&local_138);
        local_98._id = local_110->_id;
        local_98._ptr = local_110->_ptr;
        MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>::MonomSet
                  ((MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_e0,
                   (Variable)var_00,&local_98);
        ::Lib::
        Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>
        ::operator()((Map<Kernel::Variable,Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,Lib::StlHash>
                      *)this->map,(Variable)var_00,
                     (MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_e0,
                     (MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_e0);
        ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                  (&local_e0);
      }
      else {
LAB_004a0c36:
        pMVar8 = (local_60->_factors)._stack;
        local_f0 = local_60;
        pMVar2 = (local_60->_factors)._cursor;
        lVar6 = (long)pMVar2 - (long)pMVar8;
        if (pMVar8 != (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0 &&
            lVar6 != 0) {
          local_e8 = (lVar6 >> 2) * 0x6db6db6db6db6db7;
          uVar4 = (ulong)(pMVar2 != pMVar8);
          do {
            _Stack_130._mp_alloc = 0;
            _Stack_130._mp_size = 0;
            _Stack_130._mp_d = (mp_limb_t *)0x0;
            local_138 = (mp_limb_t *)
                        ((ulong)*(byte *)&(pMVar8->term).super_PolyNfSuper._inner.
                                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                          .
                                          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                        & 0xffffffffffffff03);
            f.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                       *)pMVar8;
            f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                      *)&local_138;
            ::Lib::CoproductImpl::
            RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
            ::
            switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                      ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                        *)&local_138,f);
            local_120 = pMVar8->power;
            if (((byte)local_138._0_1_ & 3) == 1) {
              key._num = local_138._1_4_;
              this_00 = this->map;
              MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>::bot();
              AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>::AnyNumber
                        ((AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)local_54,
                         (MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_e0);
              ::Lib::
              Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
              ::replaceOrInsert(this_00,key,
                                (AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)
                                local_54);
              ::Lib::CoproductImpl::
              RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>
              ::
              switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
                        (local_54,(anon_class_8_1_8991fb9c)local_54);
              ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                        (&local_e0);
            }
            if (uVar4 < local_e8) {
              pMVar8 = (local_f0->_factors)._stack + uVar4;
              uVar4 = uVar4 + 1;
            }
            else {
              pMVar8 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
            }
          } while (pMVar8 != (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0);
        }
      }
      mpz_clear(&local_78);
      mpz_clear(&local_88);
      if (local_f8 < local_100) {
        o = (local_108->_summands)._stack + local_f8;
        uVar4 = local_f8 + 1;
      }
      else {
        o = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
        uVar4 = local_f8;
      }
    } while (o != (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0);
  }
  if (local_c0._entries != (Cell *)0x0) {
    uVar4 = (long)local_c0._capacity * 8 + 0xfU & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      (local_c0._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      (local_c0._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_c0._entries;
    }
    else if (uVar4 < 0x11) {
      (local_c0._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      (local_c0._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_c0._entries;
    }
    else if (uVar4 < 0x19) {
      (local_c0._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      (local_c0._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_c0._entries;
    }
    else if (uVar4 < 0x21) {
      (local_c0._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      (local_c0._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_c0._entries;
    }
    else if (uVar4 < 0x31) {
      (local_c0._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      (local_c0._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_c0._entries;
    }
    else if (uVar4 < 0x41) {
      (local_c0._entries)->code = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      (local_c0._entries)->value = (Variable)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_c0._entries;
    }
    else {
      operator_delete(local_c0._entries,0x10);
    }
  }
  return;
}

Assistant:

void operator()(Perfect<Polynom<NumTraits>> poly)
  {
    // a variable might occur twice within one sum.
    Set<Variable, StlHash> didOccur;
    for (auto monom : poly->iterSummands()) {
      auto var = monom.tryVar();

      if (var.isSome() && !didOccur.contains(var.unwrap())) {
        auto v = var.unwrap();
        didOccur.insert(v);
        auto gen = MonomSet<NumTraits>(v, poly);
        map.updateOrInit(v,
            [&](AnyNumber<MonomSet> old_) 
            { 
              auto old = old_.downcast<NumTraits>().unwrap();
              auto result = std::move(old).intersect(std::move(gen));
              return AnyNumber<MonomSet>(std::move(result));
            },
            [&]() { return AnyNumber<MonomSet>(std::move(gen)); });
      } else {
        for (auto factor : monom.factors->iter()) {
           if (factor.term.template is<Variable>()) {
             auto v = factor.term.template unwrap<Variable>();
             map.replaceOrInsert(v, MonomSet<NumTraits>::bot());
           }
        }
      }

    }
  }